

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

bool __thiscall
spvtools::EnumSet<spv::Capability>::HasEnumAt
          (EnumSet<spv::Capability> *this,size_t bucketIndex,BucketType bucketOffset)

{
  size_type sVar1;
  const_reference pvVar2;
  BucketType bucketOffset_local;
  size_t bucketIndex_local;
  EnumSet<spv::Capability> *this_local;
  
  sVar1 = std::
          vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ::size(&this->buckets_);
  if (sVar1 <= bucketIndex) {
    __assert_fail("bucketIndex < buckets_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/enum_set.h"
                  ,0x1b4,
                  "bool spvtools::EnumSet<spv::Capability>::HasEnumAt(size_t, BucketType) const [T = spv::Capability]"
                 );
  }
  if (bucketOffset < 0x40) {
    pvVar2 = std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::operator[](&this->buckets_,bucketIndex);
    return (pvVar2->data & 1L << ((byte)bucketOffset & 0x3f)) != 0;
  }
  __assert_fail("bucketOffset < kBucketSize",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/enum_set.h"
                ,0x1b5,
                "bool spvtools::EnumSet<spv::Capability>::HasEnumAt(size_t, BucketType) const [T = spv::Capability]"
               );
}

Assistant:

bool HasEnumAt(size_t bucketIndex, BucketType bucketOffset) const {
    assert(bucketIndex < buckets_.size());
    assert(bucketOffset < kBucketSize);
    return buckets_[bucketIndex].data & (1ULL << bucketOffset);
  }